

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall QComboBoxPrivate::connectModel(QComboBoxPrivate *this)

{
  ConnectionType type;
  long in_FS_OFFSET;
  undefined1 local_60 [16];
  Object local_50 [8];
  Object local_48 [8];
  Object local_40 [8];
  Object local_38 [8];
  Object local_30 [8];
  Object local_28 [8];
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->model != (QAbstractItemModel *)0x0) {
    type = (ConnectionType)this;
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QComboBoxPrivate::*)(QModelIndex_const&,QModelIndex_const&)>
              ((Object *)local_60,(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::dataChanged,0,type);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              ((Object *)(local_60 + 8),(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::rowsAboutToBeInserted,0,type);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)(QModelIndex_const&,int,int)>
              (local_50,(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::rowsInserted,0,type);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              (local_48,(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::rowsAboutToBeRemoved,0,type);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)(QModelIndex_const&,int,int)>
              (local_40,(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::rowsRemoved,0,type);
    QObjectPrivate::connect<void(QObject::*)(QObject*),void(QComboBoxPrivate::*)()>
              (local_38,(offset_in_QObject_to_subr)this->model,(Object *)QObject::destroyed,0,type);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              (local_30,(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::modelAboutToBeReset,0,type);
    QObjectPrivate::
    connect<void(QAbstractItemModel::*)(QAbstractItemModel::QPrivateSignal),void(QComboBoxPrivate::*)()>
              (local_28,(offset_in_QAbstractItemModel_to_subr)this->model,
               (Object *)QAbstractItemModel::modelReset,0,type);
    std::array<QMetaObject::Connection,_8UL>::operator=
              (&this->modelConnections,(array<QMetaObject::Connection,_8UL> *)local_60);
    std::array<QMetaObject::Connection,_8UL>::~array
              ((array<QMetaObject::Connection,_8UL> *)local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::connectModel()
{
    if (!model)
        return;

    modelConnections = {
        QObjectPrivate::connect(model, &QAbstractItemModel::dataChanged,
                                this, &QComboBoxPrivate::dataChanged),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsAboutToBeInserted,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsInserted,
                                this, &QComboBoxPrivate::rowsInserted),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsAboutToBeRemoved,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::rowsRemoved,
                                this, &QComboBoxPrivate::rowsRemoved),
        QObjectPrivate::connect(model, &QObject::destroyed,
                                this, &QComboBoxPrivate::modelDestroyed),
        QObjectPrivate::connect(model, &QAbstractItemModel::modelAboutToBeReset,
                                this, &QComboBoxPrivate::updateIndexBeforeChange),
        QObjectPrivate::connect(model, &QAbstractItemModel::modelReset,
                                this, &QComboBoxPrivate::modelReset)
    };
}